

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

int wrapped_xstat64(int vers,char *path,stat *buf)

{
  long lVar1;
  undefined8 uStack_48;
  int return_val;
  curious_metadata_record_t io_args;
  xstat_f orig_xstat64;
  stat *buf_local;
  char *path_local;
  int vers_local;
  
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  io_args._24_8_ = gotcha_get_wrappee(io_fns[10].handle);
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    uStack_48 = 0;
    io_args.call_count = 0;
    io_args._4_4_ = 0;
    io_args.filesystem = (char *)0x0;
    io_args.mount_point = (char *)0xa;
    curious_get_filesystem(path,(char **)&io_args,&io_args.filesystem);
    curious_call_callbacks(4,&stack0xffffffffffffffb8);
    path_local._4_4_ = (*(code *)io_args._24_8_)(vers,path,buf);
    uStack_48 = CONCAT44(return_val,1);
    curious_call_callbacks(5,&stack0xffffffffffffffb8);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    path_local._4_4_ = (*(code *)io_args._24_8_)(vers,path,buf);
  }
  return path_local._4_4_;
}

Assistant:

int wrapped_xstat64(int vers, const char* path, struct stat* buf)
{
    WRAPPER_ENTER(xstat64);

    // Get the handle for the original function
    xstat_f orig_xstat64 = (xstat_f) gotcha_get_wrappee(io_fns[CURIOUS_XSTAT64_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .function_id = CURIOUS_XSTAT64_ID,
        };

        curious_get_filesystem(path, &io_args.filesystem, &io_args.mount_point);

        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_xstat64(vers, path, buf);
        io_args.call_count = 1;

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, xstat64);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_xstat64(vers, path, buf), xstat64);
    }
}